

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::enumGroupNames
                (UCharNames *names,uint16_t *group,UChar32 start,UChar32 end,UEnumCharNamesFn *fn,
                void *context,UCharNameChoice nameChoice)

{
  char *otherName_00;
  UBool UVar1;
  char *otherName;
  char local_1a8 [6];
  uint16_t length;
  char buffer [200];
  uint8_t *s;
  uint16_t lengths [34];
  uint16_t local_88 [4];
  uint16_t offsets [34];
  void *context_local;
  UEnumCharNamesFn *fn_local;
  UChar32 end_local;
  UChar32 start_local;
  uint16_t *group_local;
  UCharNames *names_local;
  
  buffer._192_8_ =
       (long)&names->tokenStringOffset +
       (long)CONCAT22(group[1],group[2]) + (ulong)names->groupStringOffset;
  buffer._192_8_ = expandGroupLengths((uint8_t *)buffer._192_8_,local_88,(uint16_t *)&s);
  fn_local._4_4_ = start;
  if (fn == (UEnumCharNamesFn *)0x0) {
    otherName_00 = *context;
    for (; (int)fn_local._4_4_ <= end; fn_local._4_4_ = fn_local._4_4_ + 1) {
      UVar1 = compareName(names,(uint8_t *)
                                (buffer._192_8_ +
                                (long)(int)(uint)offsets[((long)(int)fn_local._4_4_ & 0x1fU) - 4]),
                          lengths[((long)(int)fn_local._4_4_ & 0x1fU) - 4],nameChoice,otherName_00);
      if (UVar1 != '\0') {
        *(uint32_t *)((long)context + 8) = fn_local._4_4_;
        return '\0';
      }
    }
  }
  else {
    for (; (int)fn_local._4_4_ <= end; fn_local._4_4_ = fn_local._4_4_ + 1) {
      otherName._6_2_ =
           expandName(names,(uint8_t *)
                            (buffer._192_8_ +
                            (long)(int)(uint)offsets[((long)(int)fn_local._4_4_ & 0x1fU) - 4]),
                      lengths[((long)(int)fn_local._4_4_ & 0x1fU) - 4],nameChoice,local_1a8,200);
      if ((otherName._6_2_ == 0) && (nameChoice == U_EXTENDED_CHAR_NAME)) {
        otherName._6_2_ = getExtName(fn_local._4_4_,local_1a8,200);
        local_1a8[otherName._6_2_] = '\0';
      }
      if ((otherName._6_2_ != 0) &&
         (UVar1 = (*fn)(context,fn_local._4_4_,nameChoice,local_1a8,(int32_t)otherName._6_2_),
         UVar1 == '\0')) {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

static UBool
enumGroupNames(UCharNames *names, const uint16_t *group,
               UChar32 start, UChar32 end,
               UEnumCharNamesFn *fn, void *context,
               UCharNameChoice nameChoice) {
    uint16_t offsets[LINES_PER_GROUP+2], lengths[LINES_PER_GROUP+2];
    const uint8_t *s=(uint8_t *)names+names->groupStringOffset+GET_GROUP_OFFSET(group);

    s=expandGroupLengths(s, offsets, lengths);
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;

        while(start<=end) {
            length=expandName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, buffer, sizeof(buffer));
            if (!length && nameChoice == U_EXTENDED_CHAR_NAME) {
                buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            }
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, nameChoice, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    } else {
        const char *otherName=((FindName *)context)->otherName;
        while(start<=end) {
            if(compareName(names, s+offsets[start&GROUP_MASK], lengths[start&GROUP_MASK], nameChoice, otherName)) {
                ((FindName *)context)->code=start;
                return FALSE;
            }
            ++start;
        }
    }
    return TRUE;
}